

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O1

bool __thiscall
om::file::simple_binary_reader<test_format>::next
          (simple_binary_reader<test_format> *this,test_format *t_)

{
  test_format *ptVar1;
  long lVar2;
  bool bVar3;
  
  if (this->_use_buffer == true) {
    ptVar1 = (this->_iter)._M_current;
    (this->_iter)._M_current = ptVar1 + 1;
    *t_ = *ptVar1;
  }
  else {
    std::istream::read((char *)&(this->super__file_stream)._stream,(long)t_);
  }
  if (this->_use_buffer == true) {
    bVar3 = (this->_iter)._M_current ==
            (this->_data).super__Vector_base<test_format,_std::allocator<test_format>_>._M_impl.
            super__Vector_impl_data._M_finish;
  }
  else {
    lVar2 = std::istream::tellg();
    bVar3 = lVar2 == -1;
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool next(T& t_)
			{
				if (_use_buffer)
					t_ = *(_iter++);
				else
					_stream.read((char*) &t_, sizeof(T));

				return !done();
			}